

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsHessian_ASA_FSA.c
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  long *plVar7;
  long *plVar8;
  undefined8 *cvode_mem_00;
  undefined8 *puVar9;
  char *funcname;
  sunrealtype H22;
  sunrealtype H11;
  sunrealtype grdG_cntr [2];
  sunrealtype grdG_bck [2];
  sunrealtype grdG_fwd [2];
  sunrealtype Gm;
  sunrealtype Gp;
  sunrealtype G;
  sunrealtype dp;
  sunrealtype time;
  int retval;
  int indexB2;
  int indexB1;
  int ncheck;
  int steps;
  N_Vector yQB2;
  N_Vector yQB1;
  N_Vector yB2;
  N_Vector yB1;
  N_Vector *yQS;
  N_Vector *yS;
  N_Vector yQ;
  N_Vector y;
  sunrealtype abstolQB;
  sunrealtype abstolB;
  sunrealtype abstolQ;
  sunrealtype abstol;
  sunrealtype reltol;
  sunrealtype tf;
  sunrealtype t0;
  int Np;
  sunindextype Np2;
  sunindextype Neq;
  void *cvode_mem;
  SUNLinearSolver LSB2;
  SUNLinearSolver LSB1;
  SUNLinearSolver LS;
  SUNMatrix AB2;
  SUNMatrix AB1;
  SUNMatrix A;
  UserData data;
  SUNContext sunctx;
  undefined8 in_stack_fffffffffffffe98;
  int opt;
  char *in_stack_fffffffffffffea0;
  void *in_stack_fffffffffffffea8;
  undefined1 local_108 [12];
  int local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  uint local_f0 [2];
  long *local_e8;
  long *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  void *pvVar10;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  double *local_20;
  undefined8 local_18 [2];
  int local_4;
  
  local_4 = 0;
  local_20 = (double *)0x0;
  local_d8 = 0;
  local_d0 = 0;
  local_e8 = (long *)0x0;
  local_e0 = (long *)0x0;
  local_38 = 0;
  local_30 = 0;
  local_28 = 0;
  local_50 = 0;
  local_48 = 0;
  local_40 = 0;
  local_58 = 0;
  local_20 = (double *)malloc(0x10);
  *local_20 = 1.0;
  local_20[1] = 2.0;
  pvVar10 = (void *)0x3e45798ee2308c3a;
  local_fc = SUNContext_Create(0,local_18);
  opt = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt);
  if (iVar6 == 0) {
    plVar7 = (long *)N_VNew_Serial(3,local_18[0]);
    iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt);
    if (iVar6 == 0) {
      N_VConst(0x3ff0000000000000,plVar7);
      plVar8 = (long *)N_VNew_Serial(1,local_18[0]);
      iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt);
      if (iVar6 == 0) {
        N_VConst(plVar8);
        cvode_mem_00 = (undefined8 *)N_VCloneVectorArray(2,plVar7);
        iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt);
        if (iVar6 == 0) {
          N_VConst(*cvode_mem_00);
          N_VConst(cvode_mem_00[1]);
          puVar9 = (undefined8 *)N_VCloneVectorArray(2,plVar8);
          iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt);
          if (iVar6 == 0) {
            N_VConst(*puVar9);
            N_VConst(puVar9[1]);
            local_58 = CVodeCreate(2,local_18[0]);
            iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt);
            if (iVar6 == 0) {
              local_fc = CVodeInit(0,local_58,f,plVar7);
              iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt);
              if (iVar6 == 0) {
                local_fc = CVodeSStolerances(0x3e45798ee2308c3a,0x3e45798ee2308c3a,local_58);
                iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt);
                if (iVar6 == 0) {
                  local_fc = CVodeSetUserData(local_58,local_20);
                  iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt);
                  if (iVar6 == 0) {
                    local_28 = SUNDenseMatrix(3,3,local_18[0]);
                    iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt);
                    if (iVar6 == 0) {
                      local_40 = SUNLinSol_Dense(plVar7,local_28,local_18[0]);
                      iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt);
                      if (iVar6 == 0) {
                        local_fc = CVodeSetLinearSolver(local_58,local_40,local_28);
                        iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,opt
                                            );
                        if (iVar6 == 0) {
                          local_fc = CVodeQuadInit(local_58,fQ,plVar8);
                          iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                                               opt);
                          if (iVar6 == 0) {
                            local_fc = CVodeQuadSStolerances
                                                 (0x3e45798ee2308c3a,0x3e45798ee2308c3a,local_58);
                            iVar6 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0
                                                 ,opt);
                            if (iVar6 == 0) {
                              local_fc = CVodeSetQuadErrCon(local_58,1);
                              iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                   in_stack_fffffffffffffea0,opt);
                              if (iVar6 == 0) {
                                local_fc = CVodeSensInit(local_58,2,1,fS,cvode_mem_00);
                                iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                     in_stack_fffffffffffffea0,opt);
                                if (iVar6 == 0) {
                                  local_fc = CVodeSensEEtolerances(local_58);
                                  iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                       in_stack_fffffffffffffea0,opt);
                                  if (iVar6 == 0) {
                                    local_fc = CVodeSetSensErrCon(local_58,1);
                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                         in_stack_fffffffffffffea0,opt);
                                    if (iVar6 == 0) {
                                      local_fc = CVodeQuadSensInit(local_58,fQS,puVar9);
                                      iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                           in_stack_fffffffffffffea0,opt);
                                      if (iVar6 == 0) {
                                        local_fc = CVodeQuadSensEEtolerances(local_58);
                                        iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                             in_stack_fffffffffffffea0,opt);
                                        if (iVar6 == 0) {
                                          local_fc = CVodeSetQuadSensErrCon(local_58,1);
                                          iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                               in_stack_fffffffffffffea0,opt);
                                          if (iVar6 == 0) {
                                            local_f0[1] = 100;
                                            local_fc = CVodeAdjInit(local_58,100,2);
                                            iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                 in_stack_fffffffffffffea0,opt);
                                            if (iVar6 == 0) {
                                              printf("-------------------\n");
                                              printf("Forward integration\n");
                                              printf("-------------------\n\n");
                                              local_fc = CVodeF(0x4000000000000000,local_58,plVar7,
                                                                local_108,1,local_f0);
                                              iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                   in_stack_fffffffffffffea0,opt);
                                              if (iVar6 == 0) {
                                                local_fc = CVodeGetQuad(local_58,local_108,plVar8);
                                                iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                     in_stack_fffffffffffffea0,opt);
                                                if (iVar6 == 0) {
                                                  dVar1 = **(double **)(*plVar8 + 0x10);
                                                  local_fc = CVodeGetSens(local_58,local_108,
                                                                          cvode_mem_00);
                                                  iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                       in_stack_fffffffffffffea0,opt
                                                                      );
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeGetQuadSens(local_58,local_108,
                                                                                puVar9);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      printf("ncheck = %d\n",(ulong)local_f0[0]);
                                                      printf("\n");
                                                      printf("     y:    %12.4e %12.4e %12.4e",
                                                             **(undefined8 **)(*plVar7 + 0x10),
                                                             *(undefined8 *)
                                                              (*(long *)(*plVar7 + 0x10) + 8),
                                                             *(undefined8 *)
                                                              (*(long *)(*plVar7 + 0x10) + 0x10));
                                                      printf("     G:    %12.4e\n",
                                                             **(undefined8 **)(*plVar8 + 0x10));
                                                      printf("\n");
                                                      printf("     yS1:  %12.4e %12.4e %12.4e\n",
                                                             **(undefined8 **)
                                                               (*(long *)*cvode_mem_00 + 0x10),
                                                             *(undefined8 *)
                                                              (*(long *)(*(long *)*cvode_mem_00 +
                                                                        0x10) + 8),
                                                             *(undefined8 *)
                                                              (*(long *)(*(long *)*cvode_mem_00 +
                                                                        0x10) + 0x10));
                                                      printf("     yS2:  %12.4e %12.4e %12.4e\n",
                                                             **(undefined8 **)
                                                               (*(long *)cvode_mem_00[1] + 0x10),
                                                             *(undefined8 *)
                                                              (*(long *)(*(long *)cvode_mem_00[1] +
                                                                        0x10) + 8),
                                                             *(undefined8 *)
                                                              (*(long *)(*(long *)cvode_mem_00[1] +
                                                                        0x10) + 0x10));
                                                      printf("\n");
                                                      printf("   dG/dp:  %12.4e %12.4e\n",
                                                             **(undefined8 **)
                                                               (*(long *)*puVar9 + 0x10),
                                                             **(undefined8 **)
                                                               (*(long *)puVar9[1] + 0x10));
                                                      printf("\n");
                                                      printf("Final Statistics for forward pb.\n");
                                                      printf("--------------------------------\n");
                                                      local_fc = PrintFwdStats(pvVar10);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_d0 = N_VNew_Serial(6,local_18[0]);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      N_VConst(local_d0);
                                                      local_e0 = (long *)N_VNew_Serial(4,local_18[0]
                                                                                      );
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    N_VConst(local_e0);
                                                    local_d8 = N_VNew_Serial(6,local_18[0]);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      N_VConst(local_d8);
                                                      local_e8 = (long *)N_VNew_Serial(4,local_18[0]
                                                                                      );
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    N_VConst(local_e8);
                                                    local_fc = CVodeCreateB(local_58,2,&local_f4);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeInitBS(0x4000000000000000,
                                                                             local_58,local_f4,fB1,
                                                                             local_d0);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeSStolerancesB(0x3e45798ee2308c3a
                                                                                  ,pvVar10,local_58,
                                                                                  local_f4);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeSetUserDataB(local_58,local_f4
                                                                                   ,local_20);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeQuadInitBS(local_58,local_f4,
                                                                               fQB1,local_e0);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeQuadSStolerancesB
                                                                           (0x3e45798ee2308c3a,
                                                                            0x3e45798ee2308c3a,
                                                                            local_58,local_f4);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeSetQuadErrConB(local_58,local_f4
                                                                                   ,1);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_30 = SUNDenseMatrix(6,6,local_18[0]);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_48 = SUNLinSol_Dense(local_d0,local_30,
                                                                               local_18[0]);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeSetLinearSolverB
                                                                           (local_58,local_f4,
                                                                            local_48,local_30);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeCreateB(local_58,2,&local_f8);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeInitBS(0x4000000000000000,
                                                                             local_58,local_f8,fB2,
                                                                             local_d8);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeSStolerancesB(0x3e45798ee2308c3a
                                                                                  ,pvVar10,local_58,
                                                                                  local_f8);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeSetUserDataB(local_58,local_f8
                                                                                   ,local_20);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeQuadInitBS(local_58,local_f8,
                                                                               fQB2,local_e8);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeQuadSStolerancesB
                                                                           (0x3e45798ee2308c3a,
                                                                            0x3e45798ee2308c3a,
                                                                            local_58,local_f8);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeSetQuadErrConB(local_58,local_f8
                                                                                   ,1);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_38 = SUNDenseMatrix(6,6,local_18[0]);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_50 = SUNLinSol_Dense(local_d8,local_38,
                                                                               local_18[0]);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeSetLinearSolverB
                                                                           (local_58,local_f8,
                                                                            local_50,local_38);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    printf(
                                                  "---------------------------------------------\n")
                                                  ;
                                                  printf(
                                                  "Backward integration ... (2 adjoint problems)\n")
                                                  ;
                                                  printf(
                                                  "---------------------------------------------\n\n"
                                                  );
                                                  local_fc = CVodeB(0,local_58,1);
                                                  iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                       in_stack_fffffffffffffea0,opt
                                                                      );
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeGetB(local_58,local_f4,local_108
                                                                         ,local_d0);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeGetQuadB(local_58,local_f4,
                                                                               local_108,local_e0);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeGetB(local_58,local_f8,local_108
                                                                         ,local_d8);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeGetQuadB(local_58,local_f8,
                                                                               local_108,local_e8);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    printf(
                                                  "   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n"
                                                  ,**(ulong **)(*local_e0 + 0x10) ^
                                                   0x8000000000000000,
                                                  *(ulong *)(*(long *)(*local_e0 + 0x10) + 8) ^
                                                  0x8000000000000000);
                                                  printf(
                                                  "           %12.4e %12.4e   (from backward pb. 2)\n"
                                                  ,**(ulong **)(*local_e8 + 0x10) ^
                                                   0x8000000000000000,
                                                  *(ulong *)(*(long *)(*local_e8 + 0x10) + 8) ^
                                                  0x8000000000000000);
                                                  printf("\n");
                                                  printf("   H = d2G/dp2:\n");
                                                  printf("        (1)            (2)\n");
                                                  printf("  %12.4e   %12.4e\n",
                                                         *(ulong *)(*(long *)(*local_e0 + 0x10) +
                                                                   0x10) ^ 0x8000000000000000,
                                                         *(ulong *)(*(long *)(*local_e8 + 0x10) +
                                                                   0x10) ^ 0x8000000000000000);
                                                  printf("  %12.4e   %12.4e\n",
                                                         *(ulong *)(*(long *)(*local_e0 + 0x10) +
                                                                   0x18) ^ 0x8000000000000000,
                                                         *(ulong *)(*(long *)(*local_e8 + 0x10) +
                                                                   0x18) ^ 0x8000000000000000);
                                                  printf("\n");
                                                  printf("Final Statistics for backward pb. 1\n");
                                                  printf("-----------------------------------\n");
                                                  local_fc = PrintBckStats(cvode_mem_00,
                                                                           (int)((ulong)puVar9 >>
                                                                                0x20));
                                                  iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                       in_stack_fffffffffffffea0,opt
                                                                      );
                                                  if (iVar6 == 0) {
                                                    printf("Final Statistics for backward pb. 2\n");
                                                    printf("-----------------------------------\n");
                                                    local_fc = PrintBckStats(cvode_mem_00,
                                                                             (int)((ulong)puVar9 >>
                                                                                  0x20));
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      CVodeFree(&local_58);
                                                      SUNLinSolFree(local_40);
                                                      SUNMatDestroy(local_28);
                                                      SUNLinSolFree(local_48);
                                                      SUNMatDestroy(local_30);
                                                      SUNLinSolFree(local_50);
                                                      SUNMatDestroy(local_38);
                                                      printf("-----------------------\n");
                                                      printf("Finite Difference tests\n");
                                                      printf("-----------------------\n\n");
                                                      printf("del_p = %g\n\n",0x3f847ae147ae147b);
                                                      local_58 = CVodeCreate(2,local_18[0]);
                                                      N_VConst(0x3ff0000000000000,plVar7);
                                                      N_VConst(plVar8);
                                                      local_fc = CVodeInit(0,local_58,f,plVar7);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeSStolerances(0x3e45798ee2308c3a,
                                                                                 0x3e45798ee2308c3a,
                                                                                 local_58);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeSetUserData(local_58,local_20)
                                                      ;
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_28 = SUNDenseMatrix(3,3,local_18[0]);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_40 = SUNLinSol_Dense(plVar7,local_28,
                                                                                 local_18[0]);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeSetLinearSolver
                                                                         (local_58,local_40,local_28
                                                                         );
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeQuadInit(local_58,fQ,plVar8);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    local_fc = CVodeQuadSStolerances
                                                                         (0x3e45798ee2308c3a,
                                                                          0x3e45798ee2308c3a,
                                                                          local_58);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeSetQuadErrCon(local_58,1);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    *local_20 = *local_20 + 0.01;
                                                    local_fc = CVode(0x4000000000000000,local_58,
                                                                     plVar7,local_108,1);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeGetQuad(local_58,local_108,
                                                                              plVar8);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    dVar2 = **(double **)(*plVar8 + 0x10);
                                                    printf("p1+  y:   %12.4e %12.4e %12.4e",
                                                           **(undefined8 **)(*plVar7 + 0x10),
                                                           *(undefined8 *)
                                                            (*(long *)(*plVar7 + 0x10) + 8),
                                                           *(undefined8 *)
                                                            (*(long *)(*plVar7 + 0x10) + 0x10));
                                                    printf("     G:   %12.4e\n",
                                                           **(undefined8 **)(*plVar8 + 0x10));
                                                    *local_20 = *local_20 - 0.02;
                                                    N_VConst(0x3ff0000000000000,plVar7);
                                                    N_VConst(plVar8);
                                                    CVodeReInit(0,local_58,plVar7);
                                                    CVodeQuadReInit(local_58,plVar8);
                                                    local_fc = CVode(0x4000000000000000,local_58,
                                                                     plVar7,local_108,1);
                                                    iVar6 = check_retval(in_stack_fffffffffffffea8,
                                                                         in_stack_fffffffffffffea0,
                                                                         opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeGetQuad(local_58,local_108,
                                                                              plVar8);
                                                      iVar6 = check_retval(in_stack_fffffffffffffea8
                                                                           ,
                                                  in_stack_fffffffffffffea0,opt);
                                                  if (iVar6 == 0) {
                                                    dVar3 = **(double **)(*plVar8 + 0x10);
                                                    printf("p1-  y:   %12.4e %12.4e %12.4e",
                                                           **(undefined8 **)(*plVar7 + 0x10),
                                                           *(undefined8 *)
                                                            (*(long *)(*plVar7 + 0x10) + 8),
                                                           *(undefined8 *)
                                                            (*(long *)(*plVar7 + 0x10) + 0x10));
                                                    printf("     G:   %12.4e\n",
                                                           **(undefined8 **)(*plVar8 + 0x10));
                                                    *local_20 = *local_20 + 0.01;
                                                    pvVar10 = (void *)((dVar2 - dVar3) / 0.02);
                                                    funcname = (char *)(((dVar2 - (dVar1 + dVar1)) +
                                                                        dVar3) / 0.0001);
                                                    local_20[1] = local_20[1] + 0.01;
                                                    N_VConst(0x3ff0000000000000,plVar7);
                                                    N_VConst(plVar8);
                                                    CVodeReInit(0,local_58,plVar7);
                                                    CVodeQuadReInit(local_58,plVar8);
                                                    local_fc = CVode(0x4000000000000000,local_58,
                                                                     plVar7,local_108,1);
                                                    iVar6 = check_retval(pvVar10,funcname,opt);
                                                    if (iVar6 == 0) {
                                                      local_fc = CVodeGetQuad(local_58,local_108,
                                                                              plVar8);
                                                      iVar6 = check_retval(pvVar10,funcname,opt);
                                                      if (iVar6 == 0) {
                                                        dVar4 = **(double **)(*plVar8 + 0x10);
                                                        printf("p2+  y:   %12.4e %12.4e %12.4e",
                                                               **(undefined8 **)(*plVar7 + 0x10),
                                                               *(undefined8 *)
                                                                (*(long *)(*plVar7 + 0x10) + 8),
                                                               *(undefined8 *)
                                                                (*(long *)(*plVar7 + 0x10) + 0x10));
                                                        printf("     G:   %12.4e\n",
                                                               **(undefined8 **)(*plVar8 + 0x10));
                                                        local_20[1] = local_20[1] - 0.02;
                                                        N_VConst(0x3ff0000000000000,plVar7);
                                                        N_VConst(plVar8);
                                                        CVodeReInit(0,local_58,plVar7);
                                                        CVodeQuadReInit(local_58,plVar8);
                                                        local_fc = CVode(0x4000000000000000,local_58
                                                                         ,plVar7,local_108,1);
                                                        iVar6 = check_retval(pvVar10,funcname,opt);
                                                        if (iVar6 == 0) {
                                                          local_fc = CVodeGetQuad(local_58,local_108
                                                                                  ,plVar8);
                                                          iVar6 = check_retval(pvVar10,funcname,opt)
                                                          ;
                                                          if (iVar6 == 0) {
                                                            dVar5 = **(double **)(*plVar8 + 0x10);
                                                            printf("p2-  y:   %12.4e %12.4e %12.4e",
                                                                   **(undefined8 **)(*plVar7 + 0x10)
                                                                   ,*(undefined8 *)
                                                                     (*(long *)(*plVar7 + 0x10) + 8)
                                                                   ,*(undefined8 *)
                                                                     (*(long *)(*plVar7 + 0x10) +
                                                                     0x10));
                                                            printf("     G:   %12.4e\n",
                                                                   **(undefined8 **)(*plVar8 + 0x10)
                                                                  );
                                                            local_20[1] = local_20[1] + 0.01;
                                                            printf("\n");
                                                            printf(
                                                  "   dG/dp:  %12.4e %12.4e   (fwd FD)\n",
                                                  (dVar2 - dVar1) / 0.01,(dVar4 - dVar1) / 0.01);
                                                  printf("           %12.4e %12.4e   (bck FD)\n",
                                                         (dVar1 - dVar3) / 0.01,
                                                         (dVar1 - dVar5) / 0.01);
                                                  printf("           %12.4e %12.4e   (cntr FD)\n",
                                                         pvVar10,(dVar4 - dVar5) / 0.02);
                                                  printf("\n");
                                                  printf("  H(1,1):  %12.4e\n",funcname);
                                                  printf("  H(2,2):  %12.4e\n",
                                                         ((dVar4 - (dVar1 + dVar1)) + dVar5) /
                                                         0.0001);
                                                  CVodeFree(&local_58);
                                                  SUNLinSolFree(local_40);
                                                  SUNMatDestroy(local_28);
                                                  N_VDestroy(plVar7);
                                                  N_VDestroy(plVar8);
                                                  N_VDestroyVectorArray(cvode_mem_00,2);
                                                  N_VDestroyVectorArray(puVar9,2);
                                                  N_VDestroy(local_d0);
                                                  N_VDestroy(local_e0);
                                                  N_VDestroy(local_d8);
                                                  N_VDestroy(local_e8);
                                                  SUNContext_Free(local_18);
                                                  free(local_20);
                                                  local_4 = 0;
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                }
                                                else {
                                                  local_4 = 1;
                                                }
                                              }
                                              else {
                                                local_4 = 1;
                                              }
                                            }
                                            else {
                                              local_4 = 1;
                                            }
                                          }
                                          else {
                                            local_4 = 1;
                                          }
                                        }
                                        else {
                                          local_4 = 1;
                                        }
                                      }
                                      else {
                                        local_4 = 1;
                                      }
                                    }
                                    else {
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  UserData data;

  SUNMatrix A, AB1, AB2;
  SUNLinearSolver LS, LSB1, LSB2;
  void* cvode_mem;

  sunindextype Neq, Np2;
  int Np;

  sunrealtype t0, tf;

  sunrealtype reltol;
  sunrealtype abstol, abstolQ, abstolB, abstolQB;

  N_Vector y, yQ;
  N_Vector *yS, *yQS;
  N_Vector yB1, yB2;
  N_Vector yQB1, yQB2;

  int steps, ncheck;
  int indexB1, indexB2;

  int retval;
  sunrealtype time;

  sunrealtype dp;
  sunrealtype G, Gp, Gm;
  sunrealtype grdG_fwd[2], grdG_bck[2], grdG_cntr[2];
  sunrealtype H11, H22;

  data = NULL;
  y = yQ = NULL;
  yB1 = yB2 = NULL;
  yQB1 = yQB2 = NULL;
  A = AB1 = AB2 = NULL;
  LS = LSB1 = LSB2 = NULL;
  cvode_mem        = NULL;

  /* User data structure */

  data     = (UserData)malloc(sizeof *data);
  data->p1 = SUN_RCONST(1.0);
  data->p2 = SUN_RCONST(2.0);

  /* Problem size, integration interval, and tolerances */

  Neq = 3;
  Np  = 2;
  Np2 = 2 * Np;

  t0 = 0.0;
  tf = 2.0;

  reltol = 1.0e-8;

  abstol  = 1.0e-8;
  abstolQ = 1.0e-8;

  abstolB  = 1.0e-8;
  abstolQB = 1.0e-8;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initializations for forward problem */

  y = N_VNew_Serial(Neq, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ONE, y);

  yQ = N_VNew_Serial(1, sunctx);
  if (check_retval((void*)yQ, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yQ);

  yS = N_VCloneVectorArray(Np, y);
  if (check_retval((void*)yS, "N_VCloneVectorArray", 0)) { return (1); }
  N_VConst(ZERO, yS[0]);
  N_VConst(ZERO, yS[1]);

  yQS = N_VCloneVectorArray(Np, yQ);
  if (check_retval((void*)yQS, "N_VCloneVectorArray", 0)) { return (1); }
  N_VConst(ZERO, yQS[0]);
  N_VConst(ZERO, yQS[1]);

  /* Create and initialize forward problem */

  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  retval = CVodeInit(cvode_mem, f, t0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  A = SUNDenseMatrix(Neq, Neq, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver for the forward problem */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  retval = CVodeQuadInit(cvode_mem, fQ, yQ);
  if (check_retval(&retval, "CVodeQuadInit", 1)) { return (1); }

  retval = CVodeQuadSStolerances(cvode_mem, reltol, abstolQ);
  if (check_retval(&retval, "CVodeQuadSStolerances", 1)) { return (1); }

  retval = CVodeSetQuadErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrCon", 1)) { return (1); }

  retval = CVodeSensInit(cvode_mem, Np, CV_SIMULTANEOUS, fS, yS);
  if (check_retval(&retval, "CVodeSensInit", 1)) { return (1); }

  retval = CVodeSensEEtolerances(cvode_mem);
  if (check_retval(&retval, "CVodeSensEEtolerances", 1)) { return (1); }

  retval = CVodeSetSensErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetSensErrCon", 1)) { return (1); }

  retval = CVodeQuadSensInit(cvode_mem, fQS, yQS);
  if (check_retval(&retval, "CVodeQuadSensInit", 1)) { return (1); }

  retval = CVodeQuadSensEEtolerances(cvode_mem);
  if (check_retval(&retval, "CVodeQuadSensEEtolerances", 1)) { return (1); }

  retval = CVodeSetQuadSensErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadSensErrCon", 1)) { return (1); }

  /* Initialize ASA */

  steps  = 100;
  retval = CVodeAdjInit(cvode_mem, steps, CV_POLYNOMIAL);
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Forward integration */

  printf("-------------------\n");
  printf("Forward integration\n");
  printf("-------------------\n\n");

  retval = CVodeF(cvode_mem, tf, y, &time, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  G = Ith(yQ, 1);

  retval = CVodeGetSens(cvode_mem, &time, yS);
  if (check_retval(&retval, "CVodeGetSens", 1)) { return (1); }

  retval = CVodeGetQuadSens(cvode_mem, &time, yQS);
  if (check_retval(&retval, "CVodeGetQuadSens", 1)) { return (1); }

  printf("ncheck = %d\n", ncheck);
  printf("\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("     y:    %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:    %12.4Le\n", Ith(yQ, 1));
  printf("\n");
  printf("     yS1:  %12.4Le %12.4Le %12.4Le\n", Ith(yS[0], 1), Ith(yS[0], 2),
         Ith(yS[0], 3));
  printf("     yS2:  %12.4Le %12.4Le %12.4Le\n", Ith(yS[1], 1), Ith(yS[1], 2),
         Ith(yS[1], 3));
  printf("\n");
  printf("   dG/dp:  %12.4Le %12.4Le\n", Ith(yQS[0], 1), Ith(yQS[1], 1));
#else
  printf("     y:    %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:    %12.4e\n", Ith(yQ, 1));
  printf("\n");
  printf("     yS1:  %12.4e %12.4e %12.4e\n", Ith(yS[0], 1), Ith(yS[0], 2),
         Ith(yS[0], 3));
  printf("     yS2:  %12.4e %12.4e %12.4e\n", Ith(yS[1], 1), Ith(yS[1], 2),
         Ith(yS[1], 3));
  printf("\n");
  printf("   dG/dp:  %12.4e %12.4e\n", Ith(yQS[0], 1), Ith(yQS[1], 1));
#endif
  printf("\n");

  printf("Final Statistics for forward pb.\n");
  printf("--------------------------------\n");
  retval = PrintFwdStats(cvode_mem);
  if (check_retval(&retval, "PrintFwdStats", 1)) { return (1); }

  /* Initializations for backward problems */

  yB1 = N_VNew_Serial(2 * Neq, sunctx);
  if (check_retval((void*)yB1, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yB1);

  yQB1 = N_VNew_Serial(Np2, sunctx);
  if (check_retval((void*)yQB1, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yQB1);

  yB2 = N_VNew_Serial(2 * Neq, sunctx);
  if (check_retval((void*)yB2, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yB2);

  yQB2 = N_VNew_Serial(Np2, sunctx);
  if (check_retval((void*)yQB2, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yQB2);

  /* Create and initialize backward problems (one for each column of the Hessian) */

  /* -------------------------
     First backward problem
     -------------------------*/

  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB1);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  retval = CVodeInitBS(cvode_mem, indexB1, fB1, tf, yB1);
  if (check_retval(&retval, "CVodeInitBS", 1)) { return (1); }

  retval = CVodeSStolerancesB(cvode_mem, indexB1, reltol, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  retval = CVodeSetUserDataB(cvode_mem, indexB1, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  retval = CVodeQuadInitBS(cvode_mem, indexB1, fQB1, yQB1);
  if (check_retval(&retval, "CVodeQuadInitBS", 1)) { return (1); }

  retval = CVodeQuadSStolerancesB(cvode_mem, indexB1, reltol, abstolQB);
  if (check_retval(&retval, "CVodeQuadSStolerancesB", 1)) { return (1); }

  retval = CVodeSetQuadErrConB(cvode_mem, indexB1, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrConB", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  AB1 = SUNDenseMatrix(2 * Neq, 2 * Neq, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver for the forward problem */
  LSB1 = SUNLinSol_Dense(yB1, AB1, sunctx);
  if (check_retval((void*)LSB1, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB1, LSB1, AB1);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* -------------------------
     Second backward problem
     -------------------------*/

  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB2);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  retval = CVodeInitBS(cvode_mem, indexB2, fB2, tf, yB2);
  if (check_retval(&retval, "CVodeInitBS", 1)) { return (1); }

  retval = CVodeSStolerancesB(cvode_mem, indexB2, reltol, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  retval = CVodeSetUserDataB(cvode_mem, indexB2, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  retval = CVodeQuadInitBS(cvode_mem, indexB2, fQB2, yQB2);
  if (check_retval(&retval, "CVodeQuadInitBS", 1)) { return (1); }

  retval = CVodeQuadSStolerancesB(cvode_mem, indexB2, reltol, abstolQB);
  if (check_retval(&retval, "CVodeQuadSStolerancesB", 1)) { return (1); }

  retval = CVodeSetQuadErrConB(cvode_mem, indexB2, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrConB", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  AB2 = SUNDenseMatrix(2 * Neq, 2 * Neq, sunctx);
  if (check_retval((void*)AB2, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver for the forward problem */
  LSB2 = SUNLinSol_Dense(yB2, AB2, sunctx);
  if (check_retval((void*)LSB2, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB2, LSB2, AB2);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* Backward integration */

  printf("---------------------------------------------\n");
  printf("Backward integration ... (2 adjoint problems)\n");
  printf("---------------------------------------------\n\n");

  retval = CVodeB(cvode_mem, t0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB1, &time, yB1);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetQuadB(cvode_mem, indexB1, &time, yQB1);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB2, &time, yB2);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetQuadB(cvode_mem, indexB2, &time, yQB2);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le   (from backward pb. 1)\n", -Ith(yQB1, 1),
         -Ith(yQB1, 2));
  printf("           %12.4Le %12.4Le   (from backward pb. 2)\n", -Ith(yQB2, 1),
         -Ith(yQB2, 2));
#else
  printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n", -Ith(yQB1, 1),
         -Ith(yQB1, 2));
  printf("           %12.4e %12.4e   (from backward pb. 2)\n", -Ith(yQB2, 1),
         -Ith(yQB2, 2));
#endif
  printf("\n");
  printf("   H = d2G/dp2:\n");
  printf("        (1)            (2)\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("  %12.4Le   %12.4Le\n", -Ith(yQB1, 3), -Ith(yQB2, 3));
  printf("  %12.4Le   %12.4Le\n", -Ith(yQB1, 4), -Ith(yQB2, 4));
#else
  printf("  %12.4e   %12.4e\n", -Ith(yQB1, 3), -Ith(yQB2, 3));
  printf("  %12.4e   %12.4e\n", -Ith(yQB1, 4), -Ith(yQB2, 4));
#endif
  printf("\n");

  printf("Final Statistics for backward pb. 1\n");
  printf("-----------------------------------\n");
  retval = PrintBckStats(cvode_mem, indexB1);
  if (check_retval(&retval, "PrintBckStats", 1)) { return (1); }

  printf("Final Statistics for backward pb. 2\n");
  printf("-----------------------------------\n");
  retval = PrintBckStats(cvode_mem, indexB2);
  if (check_retval(&retval, "PrintBckStats", 1)) { return (1); }

  /* Free memory */

  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB1);
  SUNMatDestroy(AB1);
  SUNLinSolFree(LSB2);
  SUNMatDestroy(AB2);

  /* Finite difference tests */

  dp = SUN_RCONST(1.0e-2);

  printf("-----------------------\n");
  printf("Finite Difference tests\n");
  printf("-----------------------\n\n");

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("del_p = %Lg\n\n", dp);
#else
  printf("del_p = %g\n\n", dp);
#endif

  cvode_mem = CVodeCreate(CV_BDF, sunctx);

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  retval = CVodeInit(cvode_mem, f, t0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  A = SUNDenseMatrix(Neq, Neq, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver for the forward problem */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  retval = CVodeQuadInit(cvode_mem, fQ, yQ);
  if (check_retval(&retval, "CVodeQuadInit", 1)) { return (1); }

  retval = CVodeQuadSStolerances(cvode_mem, reltol, abstolQ);
  if (check_retval(&retval, "CVodeQuadSStolerances", 1)) { return (1); }

  retval = CVodeSetQuadErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrCon", 1)) { return (1); }

  data->p1 += dp;

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gp = Ith(yQ, 1);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p1+  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p1+  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p1 -= 2.0 * dp;

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  CVodeReInit(cvode_mem, t0, y);
  CVodeQuadReInit(cvode_mem, yQ);

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gm = Ith(yQ, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p1-  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p1-  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p1 += dp;

  grdG_fwd[0]  = (Gp - G) / dp;
  grdG_bck[0]  = (G - Gm) / dp;
  grdG_cntr[0] = (Gp - Gm) / (2.0 * dp);
  H11          = (Gp - 2.0 * G + Gm) / (dp * dp);

  data->p2 += dp;

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  CVodeReInit(cvode_mem, t0, y);
  CVodeQuadReInit(cvode_mem, yQ);

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gp = Ith(yQ, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p2+  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p2+  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p2 -= 2.0 * dp;

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  CVodeReInit(cvode_mem, t0, y);
  CVodeQuadReInit(cvode_mem, yQ);

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gm = Ith(yQ, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p2-  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p2-  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p2 += dp;

  grdG_fwd[1]  = (Gp - G) / dp;
  grdG_bck[1]  = (G - Gm) / dp;
  grdG_cntr[1] = (Gp - Gm) / (2.0 * dp);
  H22          = (Gp - 2.0 * G + Gm) / (dp * dp);

  printf("\n");

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4Le %12.4Le   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4Le %12.4Le   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4Le\n", H11);
  printf("  H(2,2):  %12.4Le\n", H22);
#else
  printf("   dG/dp:  %12.4e %12.4e   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4e %12.4e   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4e %12.4e   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4e\n", H11);
  printf("  H(2,2):  %12.4e\n", H22);
#endif

  /* Free memory */

  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  N_VDestroy(y);
  N_VDestroy(yQ);

  N_VDestroyVectorArray(yS, Np);
  N_VDestroyVectorArray(yQS, Np);

  N_VDestroy(yB1);
  N_VDestroy(yQB1);
  N_VDestroy(yB2);
  N_VDestroy(yQB2);

  SUNContext_Free(&sunctx);

  free(data);

  return (0);
}